

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O0

void __thiscall testing::internal::linked_ptr<InotifyEvent>::depart(linked_ptr<InotifyEvent> *this)

{
  InotifyEvent *this_00;
  bool bVar1;
  linked_ptr<InotifyEvent> *this_local;
  
  bVar1 = linked_ptr_internal::depart(&this->link_);
  if ((bVar1) && (this_00 = this->value_, this_00 != (InotifyEvent *)0x0)) {
    InotifyEvent::~InotifyEvent(this_00);
    operator_delete(this_00,0x28);
  }
  return;
}

Assistant:

void depart() {
    if (link_.depart()) delete value_;
  }